

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O2

uint64_t protozero::decode_varint(char **data,char *end)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  uint uVar4;
  uint64_t val;
  uint64_t uVar5;
  undefined8 *puVar6;
  byte bVar7;
  byte *pbVar8;
  byte *pbVar9;
  pointer_____offset_0x10___ *ppuVar10;
  ulong uVar11;
  
  pcVar3 = *data;
  if ((pcVar3 != end) && (cVar1 = *pcVar3, -1 < (long)cVar1)) {
    *data = pcVar3 + 1;
    return (long)cVar1;
  }
  pbVar9 = (byte *)*data;
  if (9 < (long)end - (long)pbVar9) {
    uVar4 = *pbVar9 & 0x7f;
    uVar5 = (uint64_t)uVar4;
    if ((char)*pbVar9 < '\0') {
      uVar4 = uVar4 | (pbVar9[1] & 0x7f) << 7;
      uVar5 = (uint64_t)uVar4;
      if ((char)pbVar9[1] < '\0') {
        uVar4 = uVar4 | (pbVar9[2] & 0x7f) << 0xe;
        uVar5 = (uint64_t)uVar4;
        if ((char)pbVar9[2] < '\0') {
          uVar5 = (uint64_t)(uVar4 | (pbVar9[3] & 0x7f) << 0x15);
          if ((char)pbVar9[3] < '\0') {
            uVar5 = uVar5 | (ulong)(pbVar9[4] & 0x7f) << 0x1c;
            if ((char)pbVar9[4] < '\0') {
              uVar5 = uVar5 | (ulong)(pbVar9[5] & 0x7f) << 0x23;
              if ((char)pbVar9[5] < '\0') {
                uVar5 = uVar5 | (ulong)(pbVar9[6] & 0x7f) << 0x2a;
                if ((char)pbVar9[6] < '\0') {
                  uVar5 = uVar5 | (ulong)(pbVar9[7] & 0x7f) << 0x31;
                  if ((char)pbVar9[7] < '\0') {
                    pbVar8 = pbVar9 + 9;
                    uVar5 = uVar5 | (ulong)(pbVar9[8] & 0x7f) << 0x38;
                    if ((char)pbVar9[8] < '\0') {
                      if ((long)(char)*pbVar8 < 0) {
                        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
                        *puVar6 = &PTR__exception_0022d1c8;
                        ppuVar10 = &varint_too_long_exception::typeinfo;
                        goto LAB_00155a68;
                      }
                      uVar5 = uVar5 | (long)(char)*pbVar8 << 0x3f;
                      pbVar8 = pbVar9 + 10;
                    }
                  }
                  else {
                    pbVar8 = pbVar9 + 8;
                  }
                }
                else {
                  pbVar8 = pbVar9 + 7;
                }
              }
              else {
                pbVar8 = pbVar9 + 6;
              }
            }
            else {
              pbVar8 = pbVar9 + 5;
            }
          }
          else {
            pbVar8 = pbVar9 + 4;
          }
        }
        else {
          pbVar8 = pbVar9 + 3;
        }
      }
      else {
        pbVar8 = pbVar9 + 2;
      }
    }
    else {
LAB_0015596c:
      pbVar8 = pbVar9 + 1;
    }
    *data = (char *)pbVar8;
    return uVar5;
  }
  uVar11 = 0;
  bVar7 = 0;
  for (; pbVar9 != (byte *)end; pbVar9 = pbVar9 + 1) {
    bVar2 = *pbVar9;
    if (-1 < (char)bVar2) {
      uVar5 = (ulong)bVar2 << (bVar7 & 0x3f) | uVar11;
      goto LAB_0015596c;
    }
    uVar11 = uVar11 | (ulong)(bVar2 & 0x7f) << (bVar7 & 0x3f);
    bVar7 = bVar7 + 7;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = &PTR__exception_0022d1f0;
  ppuVar10 = &end_of_buffer_exception::typeinfo;
LAB_00155a68:
  __cxa_throw(puVar6,ppuVar10,std::exception::~exception);
}

Assistant:

inline uint64_t decode_varint(const char** data, const char* end) {
    // If this is a one-byte varint, decode it here.
    if (end != *data && ((static_cast<uint64_t>(**data) & 0x80U) == 0)) {
        const auto val = static_cast<uint64_t>(**data);
        ++(*data);
        return val;
    }
    // If this varint is more than one byte, defer to complete implementation.
    return detail::decode_varint_impl(data, end);
}